

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O0

void __thiscall OmegaOP::algoUNIMODAL(OmegaOP *this,vector<double,_std::allocator<double>_> *data)

{
  double dVar1;
  size_type sVar2;
  ulong uVar3;
  void *pvVar4;
  double **ppdVar5;
  double dVar6;
  uint local_70;
  uint local_6c;
  uint i_1;
  uint u;
  uint t;
  uint v;
  uint T;
  uint i;
  int **SLOPE;
  uint temp_indState;
  int temp_chpt;
  double temp_Q;
  double temp_cost;
  uint local_30;
  uint uStack_2c;
  Costs cost;
  uint p;
  uint n;
  vector<double,_std::allocator<double>_> *data_local;
  OmegaOP *this_local;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(data);
  uStack_2c = (uint)sVar2;
  local_30 = this->nbStates;
  Costs::Costs((Costs *)((long)&temp_cost + 7));
  temp_Q = 0.0;
  _temp_indState = -1.0;
  SLOPE._4_4_ = 0xffffffff;
  SLOPE._0_4_ = 0;
  uVar3 = SUB168(ZEXT416(local_30) * ZEXT816(8),0);
  if (SUB168(ZEXT416(local_30) * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  _T = operator_new__(uVar3);
  for (v = 0; v < local_30; v = v + 1) {
    uVar3 = SUB168(ZEXT416(uStack_2c) * ZEXT816(4),0);
    if (SUB168(ZEXT416(uStack_2c) * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    *(void **)((long)_T + (ulong)v * 8) = pvVar4;
  }
  ppdVar5 = preprocessing(this,data);
  this->S12P = ppdVar5;
  for (t = 2; t < uStack_2c + 1; t = t + 1) {
    for (u = 0; u < local_30; u = u + 1) {
      _temp_indState = INFINITY;
      SLOPE._0_4_ = 0;
      SLOPE._4_4_ = 0;
      for (i_1 = 1; i_1 < t; i_1 = i_1 + 1) {
        for (local_6c = 0; local_6c < local_30; local_6c = local_6c + 1) {
          if ((u <= local_6c) ||
             (*(int *)(*(long *)((long)_T + (ulong)local_6c * 8) + (ulong)i_1 * 4) != -1)) {
            dVar1 = this->Q[local_6c][i_1];
            dVar6 = Costs::slopeCost((Costs *)((long)&temp_cost + 7),this->states + local_6c,
                                     this->states + u,&i_1,&t,*this->S12P + i_1,*this->S12P + t,
                                     this->S12P[1] + i_1,this->S12P[1] + t,this->S12P[2] + i_1,
                                     this->S12P[2] + t);
            temp_Q = dVar1 + dVar6 + this->penalty;
            if (temp_Q < _temp_indState) {
              SLOPE._0_4_ = local_6c;
              SLOPE._4_4_ = i_1;
              _temp_indState = temp_Q;
            }
          }
        }
      }
      this->Q[u][t] = _temp_indState;
      this->lastIndState[u][t] = (uint)SLOPE;
      this->lastChpt[u][t] = SLOPE._4_4_;
      if (u < (uint)SLOPE) {
        *(undefined4 *)(*(long *)((long)_T + (ulong)u * 8) + (ulong)t * 4) = 0xffffffff;
      }
      if ((uint)SLOPE < u) {
        *(undefined4 *)(*(long *)((long)_T + (ulong)u * 8) + (ulong)t * 4) = 1;
      }
      if (((uint)SLOPE == u) &&
         (*(int *)(*(long *)((long)_T + (ulong)(uint)SLOPE * 8) + (long)(int)SLOPE._4_4_ * 4) == -1)
         ) {
        *(undefined4 *)(*(long *)((long)_T + (ulong)u * 8) + (ulong)t * 4) = 0xffffffff;
      }
    }
  }
  this->pruning = 1.0;
  for (local_70 = 0; local_70 < local_30; local_70 = local_70 + 1) {
    pvVar4 = *(void **)((long)_T + (ulong)local_70 * 8);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4);
    }
  }
  if (_T != (void *)0x0) {
    operator_delete__(_T);
  }
  return;
}

Assistant:

void OmegaOP::algoUNIMODAL(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  int** SLOPE = new int*[p];
  for(unsigned int i = 0; i < p; i++){SLOPE[i] = new int[n];}

  /// PREPROCESSING
  S12P = preprocessing(data);

  ///
  /// ALGO
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        for(unsigned int u = 0; u < p; u++) /////explore column of states
        {
          if(!(u < v && SLOPE[u][t] == -1))
          {
            temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
            if(temp_Q > temp_cost)
            {
              temp_Q = temp_cost;
              temp_indState = u;
              temp_chpt = t;
            }
          }
        }

      }
      /////
      ///// Write response
      /////
      Q[v][T] = temp_Q;
      lastIndState[v][T] = temp_indState;
      lastChpt[v][T] = temp_chpt;

      if(temp_indState > v){SLOPE[v][T] = -1;}
      if(temp_indState < v){SLOPE[v][T] = 1;}
      if(temp_indState == v){if(SLOPE[temp_indState][temp_chpt] == -1){SLOPE[v][T] = -1;}}
    }
  }

  pruning = 1;

  for(unsigned int i = 0; i < p; i++){delete(SLOPE[i]);}
  delete [] SLOPE;
  SLOPE = NULL;

}